

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O0

string * vkt::tessellation::anon_unknown_0::getProgramName
                   (string *__return_storage_ptr__,string *baseName,Winding winding,
                   bool usePointMode)

{
  ostream *poVar1;
  char *pcVar2;
  ostringstream local_198 [8];
  ostringstream str;
  bool usePointMode_local;
  Winding winding_local;
  string *baseName_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,(string *)baseName);
  poVar1 = std::operator<<(poVar1,"_");
  pcVar2 = getWindingShaderName(winding);
  poVar1 = std::operator<<(poVar1,pcVar2);
  pcVar2 = "";
  if (usePointMode) {
    pcVar2 = "_point_mode";
  }
  std::operator<<(poVar1,pcVar2);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

inline std::string getProgramName (const std::string& baseName, const Winding winding, const bool usePointMode)
{
	std::ostringstream str;
	str << baseName << "_" << getWindingShaderName(winding) << (usePointMode ? "_point_mode" : "");
	return str.str();
}